

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void writeint(char *outfile,int a)

{
  uchar local_1c [4];
  int local_18;
  uchar b [4];
  int i;
  int a_local;
  char *outfile_local;
  
  b = (uchar  [4])a;
  for (local_18 = 3; -1 < local_18; local_18 = local_18 + -1) {
    local_1c[local_18] = b[0];
    b = (uchar  [4])((int)b >> 8);
  }
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    qwrite(outfile,(char *)(local_1c + local_18),1);
  }
  return;
}

Assistant:

static void
writeint(char *outfile, int a)
{
int i;
unsigned char b[4];

	/* Write integer A one byte at a time to outfile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 */
	for (i=3; i>=0; i--) {
		b[i] = a & 0x000000ff;
		a >>= 8;
	}
	for (i=0; i<4; i++) qwrite(outfile, (char *) &b[i],1);
}